

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_suite.hpp
# Opt level: O3

void __thiscall test_suite::detail::suite_list::sort(suite_list *this)

{
  ulong uVar1;
  long lVar2;
  
  uVar1 = this->count_;
  if (uVar1 != 0) {
    lVar2 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<test_suite::detail::suite_info*,long,__gnu_cxx::__ops::_Iter_comp_iter<test_suite::detail::suite_list::sort()::_lambda(test_suite::detail::suite_info_const&,test_suite::detail::suite_info_const&)_1_>>
              (this->data_,this->data_ + uVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<test_suite::detail::suite_info*,__gnu_cxx::__ops::_Iter_comp_iter<test_suite::detail::suite_list::sort()::_lambda(test_suite::detail::suite_info_const&,test_suite::detail::suite_info_const&)_1_>>
              (this->data_,this->data_ + uVar1);
    return;
  }
  return;
}

Assistant:

void
  sort()
  {
    std::sort(
        data_,
        data_ + count_,
        []( detail::suite_info const& lhs,
            detail::suite_info const& rhs)
        {
          return std::lexicographical_compare(
              lhs.name, lhs.name + std::strlen(lhs.name),
              rhs.name, rhs.name + std::strlen(rhs.name));
        });
  }